

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int queue_segment_info(mixed_segment_info *info,mixed_segment *segment)

{
  mixed_segment_field_info *field;
  mixed_segment_info inner;
  queue_segment_data *data;
  mixed_segment *segment_local;
  mixed_segment_info *info_local;
  
  inner.fields[0x1f]._24_8_ = segment->data;
  info->name = "queue";
  info->description = "Queue multiple segments one after the other";
  info->flags = MIXED_IN;
  info->min_inputs = 0;
  info->max_inputs = *(uint32_t *)(inner.fields[0x1f]._24_8_ + 0x28);
  info->outputs = *(uint32_t *)(inner.fields[0x1f]._24_8_ + 0x18);
  if (*(int *)(inner.fields[0x1f]._24_8_ + 8) != 0) {
    memset(&field,0,0x420);
    mixed_segment_info((mixed_segment_info *)&field,
                       (mixed_segment *)**(undefined8 **)inner.fields[0x1f]._24_8_);
    info->flags = (mixed_segment_info_flags)inner.description;
    info->min_inputs = inner.description._4_4_;
    info->max_inputs = inner.flags;
    info->outputs = inner.min_inputs;
  }
  set_info_field(info->fields,1,MIXED_BOOL,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Bypass the segment\'s processing.");
  set_info_field(info->fields + 1,0x26,MIXED_SEGMENT_POINTER,1,MIXED_GET|MIXED_SEGMENT,
                 "Retrieve the currently playing segment, if any.");
  set_info_field(info->fields + 2,0x24,8,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Access the number of available input buffers.");
  set_info_field(info->fields + 3,0x25,8,1,MIXED_GET|MIXED_SET|MIXED_SEGMENT,
                 "Access the number of available output buffers.");
  clear_info_field(info->fields + 4);
  return 1;
}

Assistant:

int queue_segment_info(struct mixed_segment_info *info, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  
  info->name = "queue";
  info->description = "Queue multiple segments one after the other";
  info->flags = MIXED_INPLACE;
  info->min_inputs = 0;
  info->max_inputs = data->in_count;
  info->outputs = data->out_count;

  if(0 < data->count){
    struct mixed_segment_info inner = {0};
    mixed_segment_info(&inner, data->queue[0]);
    info->flags = inner.flags;
    info->min_inputs = inner.min_inputs;
    info->max_inputs = inner.max_inputs;
    info->outputs = inner.outputs;
  }
  
  struct mixed_segment_field_info *field = info->fields;
  set_info_field(field++, MIXED_BYPASS,
                 MIXED_BOOL, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Bypass the segment's processing.");
  
  set_info_field(field++, MIXED_CURRENT_SEGMENT,
                 MIXED_SEGMENT_POINTER, 1, MIXED_SEGMENT | MIXED_GET,
                 "Retrieve the currently playing segment, if any.");

  set_info_field(field++, MIXED_IN_COUNT,
                 MIXED_UINT32, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Access the number of available input buffers.");

  set_info_field(field++, MIXED_OUT_COUNT,
                 MIXED_UINT32, 1, MIXED_SEGMENT | MIXED_SET | MIXED_GET,
                 "Access the number of available output buffers.");

  clear_info_field(field++);
  return 1;
}